

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O2

int __thiscall crnlib::dynamic_stream::close(dynamic_stream *this,int __fd)

{
  byte bVar1;
  undefined8 unaff_RBX;
  
  bVar1 = (this->super_data_stream).field_0x1a;
  if ((bVar1 & 1) != 0) {
    (this->super_data_stream).field_0x1a = bVar1 & 0xfe;
    vector<unsigned_char>::clear(&this->m_buf);
    this->m_ofs = 0;
  }
  return (uint)CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar1) & 0xffffff01;
}

Assistant:

virtual bool close() {
    if (m_opened) {
      m_opened = false;
      m_buf.clear();
      m_ofs = 0;
      return true;
    }

    return false;
  }